

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.c
# Opt level: O1

void splitRegion(MPI_Comm Region,int rank,int *dims,lattice *grid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  int coords [2];
  undefined8 local_20;
  
  if (grid != (lattice *)0x0 && dims != (int *)0x0) {
    grid->edges = '\0';
    local_20 = 0;
    MPI_Cart_coords(Region,CONCAT44(in_register_00000034,rank),2,&local_20);
    iVar1 = grid->imax;
    iVar2 = (iVar1 * (int)local_20) / *dims;
    grid->il = iVar2;
    if (iVar2 == 0) {
      grid->edges = grid->edges | 4;
    }
    iVar3 = (((int)local_20 + 1) * iVar1) / *dims;
    if (iVar3 == iVar1) {
      grid->edges = grid->edges | 8;
    }
    grid->deli = iVar3 - iVar2;
    iVar1 = grid->jmax;
    iVar2 = (iVar1 * local_20._4_4_) / dims[1];
    grid->jb = iVar2;
    if (iVar2 == 0) {
      grid->edges = grid->edges | 2;
    }
    iVar3 = ((local_20._4_4_ + 1) * iVar1) / dims[1];
    if (iVar3 == iVar1) {
      grid->edges = grid->edges | 1;
    }
    grid->delj = iVar3 - iVar2;
  }
  return;
}

Assistant:

void splitRegion (MPI_Comm Region, int rank, int *dims, lattice *grid)
{
	if (!dims || !grid)
		return;
	grid->edges = 0;
	int coords[2] = {0,0};
	MPI_Cart_coords(Region,rank,2,coords);

	/* Left and right */
	grid->il = coords[0]*grid->imax/dims[0];
	if (grid->il == 0)
		grid->edges |= LEFT;
	int ir = (coords[0]+1)*grid->imax/dims[0];
	if (ir == grid->imax)
		grid->edges |= RIGHT;
	grid->deli = ir - grid->il;

	/* Top and bottom: */
	grid->jb = coords[1]*grid->jmax/dims[1];
	if (grid->jb == 0)
		grid->edges |= BOTTOM;
	int jt = (coords[1]+1)*grid->jmax/dims[1];
	if (jt == grid->jmax)
		grid->edges |= TOP;
	grid->delj = jt - grid->jb;
	return;
}